

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O2

vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
* __thiscall
Corrade::Utility::ConfigurationGroup::groups
          (vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
           *__return_storage_ptr__,ConfigurationGroup *this,string *name)

{
  pointer pGVar1;
  __type _Var2;
  Group *group;
  pointer __lhs;
  
  (__return_storage_ptr__->
  super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar1 = (this->_groups).
           super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (this->_groups).
               super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pGVar1; __lhs = __lhs + 1) {
    _Var2 = std::operator==(&__lhs->name,name);
    if (_Var2) {
      std::
      vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
      ::push_back(__return_storage_ptr__,&__lhs->group);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ConfigurationGroup*> ConfigurationGroup::groups(const std::string& name) {
    std::vector<ConfigurationGroup*> found;

    for(Group& group: _groups)
        if(group.name == name) found.push_back(group.group);

    return found;
}